

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O3

ostream * tcb::operator<<(ostream *os,rational<short> *r)

{
  undefined8 in_RAX;
  ostream *this;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  std::ostream::operator<<(os,r->num_);
  if (r->denom_ != 1) {
    uStack_18 = CONCAT17(0x2f,(undefined7)uStack_18);
    this = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_18 + 7),1);
    std::ostream::operator<<(this,r->denom_);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const rational<T>& r)
{
    os << r.num();
    if (r.denom() != 1) {
        os << '/' << r.denom();
    }
    return os;
}